

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

SplitTuplePromise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> * __thiscall
kj::_::ForkHub<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>>::splitImpl<0ul,1ul>
          (SplitTuplePromise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>
           *__return_storage_ptr__)

{
  Disposer *local_30;
  PromiseNode *local_28;
  Disposer *local_20;
  PromiseNode *local_18;
  
  addSplit<0ul>((ForkHub<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>> *)&local_30);
  addSplit<1ul>((ForkHub<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>> *)&local_20);
  (__return_storage_ptr__->impl).super_TupleElement<0U,_kj::Promise<void>_>.value.super_PromiseBase.
  node.disposer = local_30;
  (__return_storage_ptr__->impl).super_TupleElement<0U,_kj::Promise<void>_>.value.super_PromiseBase.
  node.ptr = local_28;
  (__return_storage_ptr__->impl).super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
  .value.super_PromiseBase.node.disposer = local_20;
  (__return_storage_ptr__->impl).super_TupleElement<1U,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
  .value.super_PromiseBase.node.ptr = local_18;
  return __return_storage_ptr__;
}

Assistant:

_::SplitTuplePromise<T> splitImpl(Indexes<indexes...>) {
    return kj::tuple(addSplit<indexes>()...);
  }